

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O2

void test_qclab_qgates_SWAP<float>(void)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  pointer *__ptr;
  char *pcVar5;
  char *in_R9;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  SquareMatrix<float> SWAP_check;
  AssertionResult gtest_ar_5;
  vector<int,_std::allocator<int>_> qubits;
  AssertionResult gtest_ar__3;
  SWAP<float> swap2;
  SWAP<float> swap;
  AssertionResult gtest_ar__12;
  AssertHelper local_280;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_278;
  int qnew_1 [2];
  int qnew [2];
  stringstream qasm;
  undefined7 uStack_257;
  array<int,_2UL> aStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  SquareMatrix<float> I3;
  SquareMatrix<float> I1;
  SquareMatrix<float> local_b0;
  SquareMatrix<float> local_a0;
  V v4;
  V v3;
  SquareMatrix<float> I2;
  SquareMatrix<float> I4;
  V v2;
  
  qclab::dense::eye<float>((dense *)&I1,2);
  qclab::dense::eye<float>((dense *)&I2,4);
  qclab::dense::eye<float>((dense *)&I3,8);
  qclab::dense::eye<float>((dense *)&I4,0x10);
  _qasm = (pointer)0x40a0000040400000;
  aStack_250._M_elems[0] = 0x40000000;
  aStack_250._M_elems[1] = 0x40e00000;
  __l._M_len = 4;
  __l._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector(&v2,__l,(allocator_type *)&gtest_ar_5);
  local_248._M_allocated_capacity = 0x3f80000040800000;
  local_248._8_8_ = 0x4040000041000000;
  _qasm = (pointer)0x40a0000040400000;
  aStack_250._M_elems[0] = 0x40000000;
  aStack_250._M_elems[1] = 0x40e00000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector(&v3,__l_00,(allocator_type *)&gtest_ar_5);
  local_228 = 0x4110000041000000;
  uStack_220 = 0x3f80000040a00000;
  local_238 = 0x4000000040e00000;
  uStack_230 = 0x40c0000040a00000;
  local_248._M_allocated_capacity = 0x3f80000040800000;
  local_248._8_8_ = 0x4040000041000000;
  _qasm = (pointer)0x40a0000040400000;
  aStack_250._M_elems[0] = 0x40000000;
  aStack_250._M_elems[1] = 0x40e00000;
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector(&v4,__l_01,(allocator_type *)&gtest_ar_5);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (QObject<float>)&PTR_nbQubits_004d07d0;
  swap.qubits_._M_elems[0] = 0;
  swap.qubits_._M_elems[1] = 1;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  gtest_ar_5._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"swap.nbQubits()","2",(int *)&gtest_ar_5,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qasm = (stringstream)0x1;
  aStack_250._M_elems[0] = 0;
  aStack_250._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qasm = (stringstream)0x1;
  aStack_250._M_elems[0] = 0;
  aStack_250._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  gtest_ar_5._0_4_ = swap.qubits_._M_elems[0];
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"swap.qubit()","0",(int *)&gtest_ar_5,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qclab::qgates::SWAP<float>::qubits(&qubits,&swap);
  gtest_ar_5._0_8_ =
       (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start._4_4_,
                qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start._0_4_) >> 2;
  SWAP_check.size_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&qasm,"qubits.size()","2",(unsigned_long *)&gtest_ar_5,(int *)&SWAP_check);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  gtest_ar_5._0_8_ = gtest_ar_5._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[0]","0",
             (int *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_),(int *)&gtest_ar_5);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  gtest_ar_5._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[1]","1",
             (int *)(CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + 4),(int *)&gtest_ar_5);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qnew = (int  [2])&DAT_500000003;
  qclab::qgates::SWAP<float>::setQubits(&swap,qnew);
  qclab::qgates::SWAP<float>::qubits((vector<int,_std::allocator<int>_> *)&qasm,&swap);
  SWAP_check.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"swap.qubits()[0]","3",(int *)_qasm,(int *)&SWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qclab::qgates::SWAP<float>::qubits((vector<int,_std::allocator<int>_> *)&qasm,&swap);
  SWAP_check.size_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"swap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&SWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qnew[0] = 0;
  qnew[1] = 1;
  qclab::qgates::SWAP<float>::setQubits(&swap,qnew);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&SWAP_check,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,1.0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==((SquareMatrix<float> *)&qasm,&SWAP_check);
  gtest_ar_5.success_ = bVar2;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&aStack_250);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&swap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar_5,
               (AssertionResult *)"swap.matrix() == SWAP_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&swap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._4_4_,
                         (int)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject.
                                     _4_4_,(int)swap2.super_QGate2<float>.super_QObject<float>.
                                                _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qclab::qgates::QGate2<float>::print(&swap.super_QGate2<float>);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_4_ =
       qclab::qgates::SWAP<float>::toQASM(&swap,(ostream *)local_248._M_local_buf,0);
  gtest_ar__3.success_ = false;
  gtest_ar__3._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"swap.toQASM( qasm )","0",(int *)&swap2,(int *)&gtest_ar__3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&swap2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&swap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    if ((long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._4_4_,
                         (int)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject.
                                     _4_4_,(int)swap2.super_QGate2<float>.super_QObject<float>.
                                                _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[18]>
            ((internal *)&swap2,"qasm.str()","\"swap q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5,
             (char (*) [18])0x3f4c9e);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if ((char)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (swap2.qubits_._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)swap2.qubits_._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap2.qubits_);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,(string *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  uVar4 = 2;
  qclab::qgates::SWAP<float>::SWAP(&swap2,2,4);
  cVar3 = (**(code **)((long)swap.super_QGate2<float>.super_QObject<float>._vptr_QObject + 0x70))
                    (&swap,&swap2);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__3.success_ = (bool)cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__3,(AssertionResult *)"swap == swap2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew_1,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew_1);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  gtest_ar__3.success_ =
       (bool)(**(code **)((long)swap.super_QGate2<float>.super_QObject<float>._vptr_QObject + 0x70))
                       (&swap,&swap2);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__3,(AssertionResult *)"swap != swap2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew_1,(Message *)&gtest_ar__12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew_1);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    if ((long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__12._1_7_,gtest_ar__12.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&SWAP_check.data_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&qubits.super__Vector_base<int,_std::allocator<int>_>);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar_5,3,5);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"swap.nbQubits()","2",(int *)&qubits,(int *)&swap);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap);
    if ((long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qasm = (stringstream)0x1;
  aStack_250._M_elems[0] = 0;
  aStack_250._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qasm = (stringstream)0x1;
  aStack_250._M_elems[0] = 0;
  aStack_250._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qclab::qgates::SWAP<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(SWAP<float> *)&gtest_ar_5);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"swap.qubits()[0]","3",(int *)_qasm,(int *)&swap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::SWAP<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(SWAP<float> *)&gtest_ar_5);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"swap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&swap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject = (QObject<float>)&DAT_500000003;
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar_5,(int *)&swap);
  SWAP_check.size_._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"swap.nbQubits()","2",(int *)&qubits,(int *)&SWAP_check);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (aStack_250._M_elems == (_Type)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)aStack_250._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if ((long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qasm = (stringstream)0x1;
  aStack_250._M_elems[0] = 0;
  aStack_250._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qasm = (stringstream)0x1;
  aStack_250._M_elems[0] = 0;
  aStack_250._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_250);
  qclab::qgates::SWAP<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(SWAP<float> *)&gtest_ar_5);
  SWAP_check.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"swap.qubits()[0]","3",(int *)_qasm,(int *)&SWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::SWAP<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(SWAP<float> *)&gtest_ar_5);
  SWAP_check.size_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"swap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&SWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)qnew,0,1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&gtest_ar_5,&v2);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)qnew,NoTrans,2,(vector<float,_std::allocator<float>_> *)&gtest_ar_5,0);
  _qasm = (pointer)0x4000000040400000;
  aStack_250._M_elems[0] = 0x40a00000;
  aStack_250._M_elems[1] = 0x40e00000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&qubits,__l_02,(allocator_type *)&swap);
  bVar2 = std::operator==((vector<float,_std::allocator<float>_> *)&gtest_ar_5,
                          (vector<float,_std::allocator<float>_> *)&qubits);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_1_ = bVar2;
  swap.qubits_._M_elems[0] = 0;
  swap.qubits_._M_elems[1] = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&SWAP_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&swap,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap2,(Message *)&SWAP_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap2);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(SWAP_check.size_._4_4_,(undefined4)SWAP_check.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(SWAP_check.size_._4_4_,(undefined4)SWAP_check.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap.qubits_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&swap,&v3);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)qnew,NoTrans,3,(vector<float,_std::allocator<float>_> *)&swap,0);
  local_248._M_allocated_capacity = 0x40e0000040000000;
  local_248._8_8_ = 0x4040000041000000;
  _qasm = (pointer)0x40a0000040400000;
  aStack_250._M_elems[0] = 0x40800000;
  aStack_250._M_elems[1] = 0x3f800000;
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&SWAP_check,__l_03,(allocator_type *)&swap2);
  bVar2 = std::operator==((vector<float,_std::allocator<float>_> *)&swap,
                          (vector<float,_std::allocator<float>_> *)&SWAP_check);
  swap2.qubits_._M_elems[0] = 0;
  swap2.qubits_._M_elems[1] = 0;
  swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_1_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&swap2,(AssertionResult *)"vec3 == check3","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,_qasm);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap2.qubits_);
  qnew_1[0] = 1;
  qnew_1[1] = 2;
  qclab::qgates::SWAP<float>::setQubits((SWAP<float> *)qnew,qnew_1);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)&swap,&v3);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)qnew,NoTrans,3,(vector<float,_std::allocator<float>_> *)&swap,0);
  local_248._M_allocated_capacity = 0x4100000040800000;
  local_248._8_8_ = 0x404000003f800000;
  _qasm = (pointer)0x4000000040400000;
  aStack_250._M_elems[0] = 0x40a00000;
  aStack_250._M_elems[1] = 0x40e00000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&SWAP_check,&qasm);
  swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_1_ =
       std::operator==((vector<float,_std::allocator<float>_> *)&swap,
                       (vector<float,_std::allocator<float>_> *)&SWAP_check);
  swap2.qubits_._M_elems[0] = 0;
  swap2.qubits_._M_elems[1] = 0;
  if (!(bool)(char)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&swap2,(AssertionResult *)"vec3 == check3","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,_qasm);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap2.qubits_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&swap2,&v4);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)qnew,NoTrans,4,(vector<float,_std::allocator<float>_> *)&swap2,0);
  local_228 = 0x40c0000040a00000;
  uStack_220 = 0x3f80000040a00000;
  local_238 = 0x4000000040e00000;
  uStack_230 = 0x4110000041000000;
  local_248._M_allocated_capacity = 0x40e0000040000000;
  local_248._8_8_ = 0x4040000041000000;
  _qasm = (pointer)0x40a0000040400000;
  aStack_250._M_elems[0] = 0x40800000;
  aStack_250._M_elems[1] = 0x3f800000;
  __l_04._M_len = 0x10;
  __l_04._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&gtest_ar__3,__l_04,
             (allocator_type *)&gtest_ar__12);
  gtest_ar__12.success_ =
       std::operator==((vector<float,_std::allocator<float>_> *)&swap2,
                       (vector<float,_std::allocator<float>_> *)&gtest_ar__3);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__12,(AssertionResult *)"vec4 == check4","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,_qasm);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&qasm);
    if (local_278._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_278._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  qnew_1[0] = 0;
  qnew_1[1] = 1;
  qclab::qgates::SWAP<float>::setQubits((SWAP<float> *)qnew,qnew_1);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)&swap2,&v4);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)qnew,NoTrans,4,(vector<float,_std::allocator<float>_> *)&swap2,0);
  local_228 = 0x4110000041000000;
  uStack_220 = 0x3f80000040a00000;
  local_238 = 0x3f80000040800000;
  uStack_230 = 0x4040000041000000;
  local_248._M_allocated_capacity = 0x4000000040e00000;
  local_248._8_8_ = 0x40c0000040a00000;
  _qasm = (pointer)0x40a0000040400000;
  aStack_250._M_elems[0] = 0x40000000;
  aStack_250._M_elems[1] = 0x40e00000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&gtest_ar__3,&qasm);
  gtest_ar__12.success_ =
       std::operator==((vector<float,_std::allocator<float>_> *)&swap2,
                       (vector<float,_std::allocator<float>_> *)&gtest_ar__3);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__12,(AssertionResult *)"vec4 == check4","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,_qasm);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&qasm);
    if (local_278._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_278._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  qnew_1[0] = 2;
  qnew_1[1] = 3;
  qclab::qgates::SWAP<float>::setQubits((SWAP<float> *)qnew,qnew_1);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)&swap2,&v4);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)qnew,NoTrans,4,(vector<float,_std::allocator<float>_> *)&swap2,0);
  local_228 = 0x40a0000041000000;
  uStack_220 = 0x3f80000041100000;
  local_238 = 0x40a0000040e00000;
  uStack_230 = 0x40c0000040000000;
  local_248._M_allocated_capacity = 0x4100000040800000;
  local_248._8_8_ = 0x404000003f800000;
  _qasm = (pointer)0x4000000040400000;
  aStack_250._M_elems[0] = 0x40a00000;
  aStack_250._M_elems[1] = 0x40e00000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&gtest_ar__3,&qasm);
  gtest_ar__12.success_ =
       std::operator==((vector<float,_std::allocator<float>_> *)&swap2,
                       (vector<float,_std::allocator<float>_> *)&gtest_ar__3);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__12.success_) {
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__12,(AssertionResult *)"vec4 == check4","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,_qasm);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&qasm);
    if (local_278._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_278._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__12.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&gtest_ar__3);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&swap2);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&SWAP_check);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&swap);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&qubits);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&gtest_ar_5);
  qclab::qgates::SWAP<float>::SWAP(&swap,0,2);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&gtest_ar_5,&v3);
  qclab::qgates::SWAP<float>::apply
            (&swap,NoTrans,3,(vector<float,_std::allocator<float>_> *)&gtest_ar_5,0);
  local_248._M_allocated_capacity = 0x3f80000040a00000;
  local_248._8_8_ = 0x4040000040e00000;
  _qasm = (pointer)0x4080000040400000;
  aStack_250._M_elems[0] = 0x40000000;
  aStack_250._M_elems[1] = 0x41000000;
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&qasm;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&qubits,__l_05,(allocator_type *)&SWAP_check);
  bVar2 = std::operator==((vector<float,_std::allocator<float>_> *)&gtest_ar_5,
                          (vector<float,_std::allocator<float>_> *)&qubits);
  SWAP_check.size_._0_1_ = bVar2;
  SWAP_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&swap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&SWAP_check,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&swap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._4_4_,
                         (int)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject.
                                     _4_4_,(int)swap2.super_QGate2<float>.super_QObject<float>.
                                                _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&SWAP_check.data_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&qubits);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&gtest_ar_5);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar_5,0,1);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&qubits,&I2);
  pcVar5 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&gtest_ar_5,Left,NoTrans,2,(SquareMatrix<float> *)&qubits,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&qubits,(SquareMatrix<float> *)&qasm);
  swap.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_1_ = bVar2;
  swap.qubits_._M_elems[0] = 0;
  swap.qubits_._M_elems[1] = 0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&aStack_250);
  if ((char)swap.super_QGate2<float>.super_QObject<float>._vptr_QObject == '\0') {
    testing::Message::Message((Message *)&SWAP_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&swap,(AssertionResult *)"mat2 == swap.matrix()","false",
               "true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap2,(Message *)&SWAP_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap2);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(SWAP_check.size_._4_4_,(undefined4)SWAP_check.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(SWAP_check.size_._4_4_,(undefined4)SWAP_check.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap.qubits_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&swap,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,13.0,
             14.0,15.0,16.0);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&qubits,(SquareMatrix<float> *)&swap);
  pcVar5 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&gtest_ar_5,Left,NoTrans,2,(SquareMatrix<float> *)&qubits,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&local_a0,(SquareMatrix<float> *)&swap);
  qclab::qgates::SWAP<float>::matrix(&swap2);
  qclab::dense::operator*((dense *)&qasm,&local_a0,(SquareMatrix<float> *)&swap2);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&qubits,(SquareMatrix<float> *)&qasm);
  SWAP_check.size_._0_1_ = bVar2;
  SWAP_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&aStack_250);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&swap2.qubits_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_a0.data_);
  if ((char)SWAP_check.size_ == '\0') {
    testing::Message::Message((Message *)&swap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&SWAP_check,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&swap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._4_4_,
                         (int)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject.
                                     _4_4_,(int)swap2.super_QGate2<float>.super_QObject<float>.
                                                _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&SWAP_check.data_);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&qubits,(SquareMatrix<float> *)&swap);
  pcVar5 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&gtest_ar_5,Right,NoTrans,2,(SquareMatrix<float> *)&qubits,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_b0);
  qclab::dense::operator*((dense *)&qasm,&local_b0,(SquareMatrix<float> *)&swap);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&qubits,(SquareMatrix<float> *)&qasm);
  SWAP_check.size_._0_1_ = bVar2;
  SWAP_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&aStack_250);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_b0.data_);
  if ((char)SWAP_check.size_ == '\0') {
    testing::Message::Message((Message *)&swap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&SWAP_check,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&swap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._4_4_,
                         (int)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject.
                                     _4_4_,(int)swap2.super_QGate2<float>.super_QObject<float>.
                                                _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&SWAP_check.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&SWAP_check,&I3);
  pcVar5 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply((SWAP<float> *)&gtest_ar_5,Left,NoTrans,3,&SWAP_check,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&gtest_ar__3);
  qclab::dense::kron<float>((dense *)&qasm,(SquareMatrix<float> *)&gtest_ar__3,&I1);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==(&SWAP_check,(SquareMatrix<float> *)&qasm);
  swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_1_ = bVar2;
  swap2.qubits_._M_elems[0] = 0;
  swap2.qubits_._M_elems[1] = 0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&aStack_250);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar__3.message_);
  if ((char)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&swap2,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap2.qubits_);
  qnew[0] = 1;
  qnew[1] = 2;
  qclab::qgates::SWAP<float>::setQubits((SWAP<float> *)&gtest_ar_5,qnew);
  qclab::dense::SquareMatrix<float>::operator=(&SWAP_check,&I3);
  pcVar5 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply((SWAP<float> *)&gtest_ar_5,Left,NoTrans,3,&SWAP_check,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&gtest_ar__3);
  qclab::dense::kron<float>((dense *)&qasm,&I1,(SquareMatrix<float> *)&gtest_ar__3);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==(&SWAP_check,(SquareMatrix<float> *)&qasm);
  swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._0_1_ = bVar2;
  swap2.qubits_._M_elems[0] = 0;
  swap2.qubits_._M_elems[1] = 0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&aStack_250);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&gtest_ar__3.message_);
  if ((char)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&swap2,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,_qasm);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__12,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&swap2.qubits_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&SWAP_check.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&swap.qubits_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar_5,0,2);
  qclab::dense::zeros<float>((dense *)&qubits,8);
  *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       0x3f800000;
  lVar1 = CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_,
                   qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start._0_4_);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 + 4] = 0x3f800000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 * 2 + 2] = 0x3f800000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 * 3 + 6] = 0x3f800000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 * 4 + 1] = 0x3f800000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 * 5 + 5] = 0x3f800000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 * 6 + 3] = 0x3f800000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [lVar1 * 7 + 7] = 0x3f800000;
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&swap,&I3);
  pcVar5 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&gtest_ar_5,Left,NoTrans,3,(SquareMatrix<float> *)&swap,0);
  bVar2 = qclab::dense::SquareMatrix<float>::operator==
                    ((SquareMatrix<float> *)&swap,(SquareMatrix<float> *)&qubits);
  SWAP_check.size_._0_1_ = bVar2;
  SWAP_check.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&swap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&SWAP_check,(AssertionResult *)"mat3 == check","false",
               "true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&swap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject._4_4_,
                         (int)swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(swap2.super_QGate2<float>.super_QObject<float>._vptr_QObject.
                                     _4_4_,(int)swap2.super_QGate2<float>.super_QObject<float>.
                                                _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&SWAP_check.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&swap.qubits_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&v4.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&v3.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&v2.super__Vector_base<float,_std::allocator<float>_>);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&I4.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&I3.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&I2.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&I1.data_);
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}